

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  int iVar1;
  long lVar2;
  basic_fp<unsigned___int128> value_00;
  unsigned_long_long uVar3;
  convert_float_result<double> cVar4;
  type tVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  bool bVar8;
  decimal_fp<double> dVar9;
  basic_fp<unsigned_long_long> bVar10;
  fp fVar11;
  fp x;
  fp y;
  bool local_241;
  undefined1 local_229;
  size_t local_220;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  basic_fp<unsigned___int128> f;
  char *local_1b0;
  gen_digits_handler handler;
  fp cached_pow;
  basic_fp<unsigned_long_long> local_128;
  unsigned_long_long uStack_118;
  fp normalized;
  int cached_exp10;
  int min_exp;
  appender local_f8;
  unsigned_long local_f0;
  decimal_fp<double> dec;
  appender local_d8;
  decimal_fp<float> local_d0;
  decimal_fp<float> dec_1;
  uint dragon_flags;
  char local_ba;
  bool use_dragon;
  int exp;
  bool fixed;
  convert_float_result<double> converted_value;
  buffer<char> *buf_local;
  double dStack_a0;
  int precision_local;
  double value_local;
  float_specs specs_local;
  result result_1;
  char digit_1;
  result result;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  round_direction dir;
  uint64_t divisor;
  uint64_t fractional;
  undefined1 auStack_48 [4];
  uint32_t integral;
  fp one;
  uint64_t local_28;
  result local_c;
  
  converted_value = (convert_float_result<double>)buf;
  buf_local._4_4_ = precision;
  dStack_a0 = value;
  value_local = (double)specs;
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0xc1e,"value is negative");
  }
  _exp = convert_float<double>(value);
  cVar4 = converted_value;
  use_dragon = (char)((ulong)value_local >> 0x20) == '\x02';
  if (dStack_a0 <= 0.0) {
    if ((buf_local._4_4_ < 1) || (!use_dragon)) {
      local_ba = '0';
      buffer<char>::push_back((buffer<char> *)converted_value,&local_ba);
      specs_local.precision = 0;
    }
    else {
      tVar5 = to_unsigned<int>(buf_local._4_4_);
      buffer<char>::try_resize((buffer<char> *)cVar4,(ulong)tVar5);
      pcVar6 = buffer<char>::data((buffer<char> *)converted_value);
      fill_n<char,int>(pcVar6,buf_local._4_4_,'0');
      specs_local.precision = -buf_local._4_4_;
    }
  }
  else {
    dragon_flags = 0;
    dec_1.exponent._3_1_ = 1;
    dec_1.significand = 0;
    if (buf_local._4_4_ < 0) {
      if ((value_local._4_4_ >> 0x12 & 1) == 0) {
        dVar9 = dragonbox::to_decimal<double>(dStack_a0);
        local_f0 = dVar9.significand;
        dec.significand._0_4_ = dVar9.exponent;
        appender::back_insert_iterator(&local_f8,(buffer<char> *)converted_value);
        write<char,_fmt::v9::appender,_unsigned_long,_0>(local_f8,local_f0);
        specs_local.precision = (int)dec.significand;
      }
      else {
        local_d0 = dragonbox::to_decimal<float>((float)dStack_a0);
        appender::back_insert_iterator(&local_d8,(buffer<char> *)converted_value);
        write<char,_fmt::v9::appender,_unsigned_int,_0>(local_d8,local_d0.significand);
        specs_local.precision = local_d0.exponent;
      }
    }
    else {
      normalized._12_4_ = 0xffffffc4;
      normalized.e = 0;
      basic_fp<unsigned_long_long>::basic_fp<double>(&local_128,_exp);
      bVar10.f = (ulong)(uint)local_128.e;
      bVar10._8_8_ = extraout_RDX;
      bVar10 = normalize<0,unsigned_long_long>((detail *)local_128.f,bVar10);
      uStack_118 = bVar10.f;
      normalized.f._0_4_ = bVar10.e;
      fVar11 = get_cached_power(-0x7c - (int)normalized.f,&normalized.e);
      x.e = (int)normalized.f;
      x.f = uStack_118;
      x._12_4_ = 0;
      y._12_4_ = 0;
      y.f = SUB128(fVar11._0_12_,0);
      y.e = SUB124(fVar11._0_12_,8);
      fVar11 = operator*(x,y);
      handler._16_8_ = fVar11.f;
      normalized.f._0_4_ = fVar11.e;
      uStack_118 = handler._16_8_;
      local_1b0 = buffer<char>::data((buffer<char> *)converted_value);
      uVar3 = uStack_118;
      handler.buf._0_4_ = 0;
      handler.buf._4_4_ = buf_local._4_4_;
      handler.size = -normalized.e;
      handler.precision._0_1_ = use_dragon & 1;
      local_28 = 1;
      one._8_8_ = &local_1b0;
      basic_fp<unsigned_long_long>::basic_fp
                ((basic_fp<unsigned_long_long> *)auStack_48,1L << (-(char)(int)normalized.f & 0x3fU)
                 ,(int)normalized.f);
      uVar7 = uVar3 >> (-(char)(undefined4)one.f & 0x3fU);
      fractional._4_4_ = (uint32_t)uVar7;
      if (fractional._4_4_ == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
                    ,0xa40,"");
      }
      if ((uVar7 & 0xffffffff) != uVar3 >> (-(char)(undefined4)one.f & 0x3fU)) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
                    ,0xa41,"");
      }
      divisor = uVar3 & _auStack_48 - 1;
      dragon_flags = count_digits(fractional._4_4_);
      if (((*(byte *)(one._8_8_ + 0x14) & 1) == 0) ||
         (adjust_precision((int *)(one._8_8_ + 0xc),dragon_flags + *(int *)(one._8_8_ + 0x10)),
         0 < *(int *)(one._8_8_ + 0xc))) {
        do {
          divmod_integral.integral._0_4_ = 0;
          remainder = (uint64_t)&divmod_integral.integral;
          divmod_integral.digit = (uint32_t *)((long)&fractional + 4);
          switch(dragon_flags) {
          case 1:
            divmod_integral.integral._0_4_ = fractional._4_4_;
            fractional._4_4_ = 0;
            break;
          case 2:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10);
            break;
          case 3:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100);
            break;
          case 4:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000);
            break;
          case 5:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10000);
            break;
          case 6:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100000);
            break;
          case 7:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000000);
            break;
          case 8:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,10000000);
            break;
          case 9:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,100000000);
            break;
          case 10:
            grisu_gen_digits::anon_class_16_2_fdf32556::operator()
                      ((anon_class_16_2_fdf32556 *)&remainder,1000000000);
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/fmt-src/include/fmt/format.h"
                        ,0xa7e,"invalid number of digits");
          }
          dragon_flags = dragon_flags - 1;
          local_c = gen_digits_handler::on_digit
                              ((gen_digits_handler *)one._8_8_,
                               (char)(uint32_t)divmod_integral.integral + '0',
                               basic_data<void>::power_of_10_64[(int)dragon_flags] <<
                               (-(char)(undefined4)one.f & 0x3fU),
                               ((ulong)fractional._4_4_ << (-(char)(undefined4)one.f & 0x3fU)) +
                               divisor,1,true);
          if (local_c != more) goto LAB_0030579f;
        } while (0 < (int)dragon_flags);
        while( true ) {
          uVar7 = divisor * 10;
          local_28 = local_28 * 10;
          divisor = _auStack_48 - 1 & uVar7;
          dragon_flags = dragon_flags - 1;
          specs_local._4_4_ =
               gen_digits_handler::on_digit
                         ((gen_digits_handler *)one._8_8_,
                          (char)(uVar7 >> (-(char)(undefined4)one.f & 0x3fU)) + '0',_auStack_48,
                          divisor,local_28,false);
          local_c = specs_local._4_4_;
          if (specs_local._4_4_ != more) break;
          specs_local._4_4_ = 0;
        }
      }
      else if (*(int *)(one._8_8_ + 0xc) < 0) {
        local_c = done;
      }
      else {
        divmod_integral.integral._4_4_ =
             get_round_direction(basic_data<void>::power_of_10_64[(int)(dragon_flags - 1)] <<
                                 (-(char)(undefined4)one.f & 0x3fU),uVar3 / 10,10);
        if (divmod_integral.integral._4_4_ == unknown) {
          local_c = error;
        }
        else {
          local_229 = 0x31;
          if (divmod_integral.integral._4_4_ != up) {
            local_229 = 0x30;
          }
          lVar2 = *(long *)one._8_8_;
          iVar1 = *(int *)(one._8_8_ + 8);
          *(int *)(one._8_8_ + 8) = iVar1 + 1;
          *(undefined1 *)(lVar2 + iVar1) = local_229;
          local_c = done;
        }
      }
LAB_0030579f:
      cVar4 = converted_value;
      if (local_c == error) {
        dragon_flags = ((int)handler.buf - normalized.e) + -1 + dragon_flags;
        buf_local._4_4_ = handler.buf._4_4_;
      }
      else {
        dragon_flags = handler.size + dragon_flags;
        tVar5 = to_unsigned<int>((int)handler.buf);
        buffer<char>::try_resize((buffer<char> *)cVar4,(ulong)tVar5);
        dec_1.exponent._3_1_ = 0;
      }
      if ((dec_1.exponent._3_1_ & 1) != 0) {
        basic_fp<unsigned___int128>::basic_fp((basic_fp<unsigned___int128> *)&max_double_digits);
        if ((value_local._4_4_ >> 0x12 & 1) == 0) {
          local_241 = basic_fp<unsigned___int128>::assign<double,_0>
                                ((basic_fp<unsigned___int128> *)&max_double_digits,_exp);
        }
        else {
          local_241 = basic_fp<unsigned___int128>::assign<float,_0>
                                ((basic_fp<unsigned___int128> *)&max_double_digits,(float)dStack_a0)
          ;
        }
        if (local_241 != false) {
          dec_1.significand = dec_1.significand | 1;
        }
        if ((use_dragon & 1U) != 0) {
          dec_1.significand = dec_1.significand | 4;
        }
        if (0x2ff < buf_local._4_4_) {
          buf_local._4_4_ = 0x2ff;
        }
        value_00.f._8_8_ = (undefined8)f.f;
        value_00.f._0_8_ = _max_double_digits;
        value_00._16_8_ = f.f._8_8_;
        value_00._24_4_ = f.e;
        value_00._28_4_ = f._20_4_;
        format_dragon(value_00,dec_1.significand,buf_local._4_4_,(buffer<char> *)converted_value,
                      (int *)&dragon_flags);
      }
      if (((use_dragon & 1U) == 0) && ((value_local._4_4_ >> 0x13 & 1) == 0)) {
        local_220 = buffer<char>::size((buffer<char> *)converted_value);
        while( true ) {
          bVar8 = false;
          if (local_220 != 0) {
            pcVar6 = buffer<char>::operator[]<unsigned_long>
                               ((buffer<char> *)converted_value,local_220 - 1);
            bVar8 = *pcVar6 == '0';
          }
          if (!bVar8) break;
          local_220 = local_220 - 1;
          dragon_flags = dragon_flags + 1;
        }
        buffer<char>::try_resize((buffer<char> *)converted_value,local_220);
      }
      specs_local.precision = dragon_flags;
    }
  }
  return specs_local.precision;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}